

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_7b7f9::Player::Player
          (Player *this,
          vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
          *others,vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
                  *allplayers,Ball *ball,bool isTeamA,int id)

{
  undefined8 in_RCX;
  vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_> *in_RDX;
  vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_> *in_RSI;
  SimpleVehicle *in_RDI;
  byte in_R8B;
  int in_R9D;
  Player *in_stack_00000080;
  
  OpenSteer::SimpleVehicle::SimpleVehicle(in_RDI);
  (in_RDI->super_SimpleVehicle_3).
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace.
  _vptr_AbstractLocalSpace = (_func_int **)&PTR__Player_001c1c60;
  std::vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>::
  vector(in_RSI,in_RDX);
  std::vector<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>::
  vector(in_RSI,in_RDX);
  in_RDI[1].super_SimpleVehicle_3.
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._position.y = (float)(int)in_RCX;
  in_RDI[1].super_SimpleVehicle_3.
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._position.z =
       (float)(int)((ulong)in_RCX >> 0x20);
  *(byte *)&in_RDI[1].super_SimpleVehicle_3.
            super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
            trailVertexCount = in_R8B & 1;
  in_RDI[1].super_SimpleVehicle_3.
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.trailIndex = in_R9D
  ;
  OpenSteer::Vec3::Vec3
            ((Vec3 *)&in_RDI[1].super_SimpleVehicle_3.
                      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                      .trailDuration);
  reset(in_stack_00000080);
  return;
}

Assistant:

Player (std::vector<Player*> others, std::vector<Player*> allplayers, Ball* ball, bool isTeamA, int id) : m_others(others), m_AllPlayers(allplayers), m_Ball(ball), b_ImTeamA(isTeamA), m_MyID(id) {reset ();}